

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::Lists::Foreach::func(Foreach *this,DataList *list)

{
  value_type pOVar1;
  bool bVar2;
  Object **ppOVar3;
  Ty<11UL> *this_00;
  FuncTableUnit *ftu;
  size_t sVar4;
  Ty<17UL> *pTVar5;
  unsigned_long id_00;
  unsigned_long *puVar6;
  DataList *this_01;
  const_reference ppOVar7;
  Object *obj_00;
  FuncTableUnit *in_RDX;
  Range<unsigned_long> RVar8;
  ListType local_190;
  Object *local_178;
  List *result;
  value_type local_168;
  _Manager_type local_160;
  unsigned_long id_1;
  RIterator<unsigned_long> __end4;
  RIterator<unsigned_long> __begin4;
  Range<unsigned_long> *__range4;
  DataList ldl;
  size_t i_1;
  RIterator<unsigned_long> __end3_1;
  RIterator<unsigned_long> __begin3_1;
  Range<unsigned_long> *__range3_1;
  Object obj;
  vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> dls;
  unsigned_long i;
  RIterator<unsigned_long> __end3;
  RIterator<unsigned_long> __begin3;
  Range<unsigned_long> *__range3;
  size_t size;
  size_t minsize;
  FuncObject *rf;
  Object *local_60;
  initializer_list<ICM::Object_*> local_58;
  lightlist<ICM::Object_*> local_48;
  size_t local_30;
  size_t id;
  FuncTableUnit *func;
  DataList *list_local;
  Foreach *this_local;
  
  func = in_RDX;
  list_local = list;
  this_local = this;
  ppOVar3 = Common::lightlist<ICM::Object_*>::operator[]((lightlist<ICM::Object_*> *)in_RDX,0);
  this_00 = Object::get<11ul>(*ppOVar3);
  ftu = TypeBase::FunctionType::getData(this_00);
  local_60 = (Object *)0x21b750;
  local_58._M_array = &local_60;
  local_58._M_len = 1;
  id = (size_t)ftu;
  Common::lightlist<ICM::Object_*>::lightlist(&local_48,&local_58);
  sVar4 = getCallID(ftu,&local_48);
  Common::lightlist<ICM::Object_*>::~lightlist(&local_48);
  local_30 = sVar4;
  minsize = (size_t)FuncTableUnit::operator[]((FuncTableUnit *)id,sVar4);
  ppOVar3 = Common::lightlist<ICM::Object_*>::operator[]((lightlist<ICM::Object_*> *)func,1);
  pTVar5 = Object::get<17ul>(*ppOVar3);
  size = TypeBase::ListType::size(pTVar5);
  sVar4 = Common::lightlist<ICM::Object_*>::size((lightlist<ICM::Object_*> *)func);
  ___begin3 = (RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>)Common::range(1,sVar4);
  __end3 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin
                     ((RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *)&__begin3);
  i = (unsigned_long)
      Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end
                ((RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *)&__begin3);
  while( true ) {
    bVar2 = Common::RIterator<unsigned_long>::operator!=(&__end3,(RIterator<unsigned_long> *)&i);
    if (!bVar2) break;
    id_00 = Common::RIterator<unsigned_long>::operator*(&__end3);
    ppOVar3 = Common::lightlist<ICM::Object_*>::operator[]((lightlist<ICM::Object_*> *)func,id_00);
    pTVar5 = Object::get<17ul>(*ppOVar3);
    dls.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)TypeBase::ListType::size(pTVar5);
    puVar6 = std::min<unsigned_long>
                       (&size,(unsigned_long *)
                              &dls.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    size = *puVar6;
    Common::RIterator<unsigned_long>::operator++(&__end3);
  }
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::vector
            ((vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&obj.data);
  Object::Object((Object *)&__range3_1,0,(DataPointer)0x0);
  RVar8 = Common::range(0,size);
  __begin3_1.value = RVar8.super_RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>._begin;
  __end3_1 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin
                       ((RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *)&__begin3_1);
  i_1 = (size_t)Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end
                          ((RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *)
                           &__begin3_1);
  while( true ) {
    bVar2 = Common::RIterator<unsigned_long>::operator!=(&__end3_1,(RIterator<unsigned_long> *)&i_1)
    ;
    if (!bVar2) break;
    ldl._data.super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         Common::RIterator<unsigned_long>::operator*(&__end3_1);
    Common::lightlist<ICM::Object_*>::lightlist((lightlist<ICM::Object_*> *)&__range4,sVar4 - 1);
    RVar8 = Common::range(1,sVar4);
    __begin4.value = RVar8.super_RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>._begin;
    __end4 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin
                       ((RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *)&__begin4);
    id_1 = (unsigned_long)
           Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end
                     ((RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *)&__begin4);
    while( true ) {
      bVar2 = Common::RIterator<unsigned_long>::operator!=
                        (&__end4,(RIterator<unsigned_long> *)&id_1);
      if (!bVar2) break;
      local_160 = (_Manager_type)Common::RIterator<unsigned_long>::operator*(&__end4);
      ppOVar3 = Common::lightlist<ICM::Object_*>::operator[]
                          ((lightlist<ICM::Object_*> *)func,(size_t)local_160);
      pTVar5 = Object::get<17ul>(*ppOVar3);
      this_01 = TypeBase::ListType::getData(pTVar5);
      ppOVar7 = std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::operator[]
                          (this_01,(size_type)
                                   ldl._data.
                                   super___shared_ptr<ICM::Object_*,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi);
      pOVar1 = *ppOVar7;
      ppOVar3 = Common::lightlist<ICM::Object_*>::operator[]
                          ((lightlist<ICM::Object_*> *)&__range4,(size_t)(local_160 + -1));
      *ppOVar3 = pOVar1;
      Common::RIterator<unsigned_long>::operator++(&__end4);
    }
    Function::FuncObject::call((FuncObject *)&result,(DataList *)minsize);
    local_168 = ObjectPtr::get((ObjectPtr *)&result);
    std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::push_back
              ((vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&obj.data,&local_168);
    Common::lightlist<ICM::Object_*>::~lightlist((lightlist<ICM::Object_*> *)&__range4);
    Common::RIterator<unsigned_long>::operator++(&__end3_1);
  }
  obj_00 = (Object *)operator_new(0x10);
  TypeBase::ListType::ListType(&local_190,(DataList *)&obj.data);
  Objects::DataObject<(ICM::DefaultType)17>::DataObject
            ((DataObject<(ICM::DefaultType)17> *)obj_00,&local_190);
  TypeBase::ListType::~ListType(&local_190);
  local_178 = obj_00;
  ObjectPtr::ObjectPtr((ObjectPtr *)this,obj_00);
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::~vector
            ((vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&obj.data);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					// TODO
					auto &func = list[0]->get<T_Function>()->getData();
					size_t id = getCallID(func, DataList({ &Static.Zero }));
					const auto &rf = func[id];

					size_t minsize = list[1]->get<T_List>()->size();
					size_t size = list.size();
					for (auto i : range(1, size))
						minsize = std::min(minsize, list[i]->get<T_List>()->size());
					vector<Object*> dls;
					Object obj;
					for (size_t i : range(0, minsize)) {
						DataList ldl(size - 1);
						for (auto id : range(1, size))
							ldl[id - 1] = list[id]->get<T_List>()->getData()[i];
						dls.push_back(rf.call(ldl).get());
					}
					List *result = new List(ListType(dls));
					return ObjectPtr(result);
				}